

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O3

void mpp_h264d_fill_dynamic_meta(H264dCurCtx_t *p_Cur,RK_U8 *data,RK_U32 size,RK_U32 hdr_fmt)

{
  MppFrameHdrDynamicMeta *ptr;
  MppFrameHdrDynamicMeta *__dest;
  uint uVar1;
  ulong uVar2;
  
  ptr = p_Cur->hdr_dynamic_meta;
  uVar2 = (ulong)(size + 4);
  if (hdr_fmt != 0xb) {
    uVar2 = (ulong)size;
  }
  uVar1 = (uint)uVar2;
  if (ptr != (MppFrameHdrDynamicMeta *)0x0) {
    if (uVar1 <= ptr->size) goto LAB_0018aed2;
    mpp_osal_free("mpp_h264d_fill_dynamic_meta",ptr);
  }
  ptr = (MppFrameHdrDynamicMeta *)mpp_osal_calloc("mpp_h264d_fill_dynamic_meta",uVar2 + 8);
  if (ptr == (MppFrameHdrDynamicMeta *)0x0) {
    _mpp_log_l(2,"h264d_parse","malloc hdr dynamic data failed!\n","mpp_h264d_fill_dynamic_meta");
    return;
  }
LAB_0018aed2:
  if (data != (RK_U8 *)0x0 && uVar1 != 0) {
    if (hdr_fmt == 0xb) {
      ptr[1].hdr_fmt = 0x1000000;
      __dest = (MppFrameHdrDynamicMeta *)&ptr[1].size;
    }
    else {
      __dest = ptr + 1;
    }
    memcpy(__dest,data,(ulong)size);
    ptr->size = uVar1;
    ptr->hdr_fmt = hdr_fmt;
  }
  p_Cur->hdr_dynamic_meta = ptr;
  p_Cur->hdr_dynamic = 1;
  return;
}

Assistant:

void mpp_h264d_fill_dynamic_meta(H264dCurCtx_t *p_Cur, const RK_U8 *data, RK_U32 size, RK_U32 hdr_fmt)
{
    MppFrameHdrDynamicMeta *hdr_dynamic_meta = p_Cur->hdr_dynamic_meta;

    if (hdr_fmt == DOLBY)
        size += 4;

    if (hdr_dynamic_meta && (hdr_dynamic_meta->size < size)) {
        mpp_free(hdr_dynamic_meta);
        hdr_dynamic_meta = NULL;
    }

    if (!hdr_dynamic_meta) {
        hdr_dynamic_meta = mpp_calloc_size(MppFrameHdrDynamicMeta,
                                           sizeof(MppFrameHdrDynamicMeta) + size);
        if (!hdr_dynamic_meta) {
            mpp_err_f("malloc hdr dynamic data failed!\n");
            return;
        }
    }
    if (size && data) {
        if (hdr_fmt == DOLBY) {
            RK_U8 start_code[4] = {0, 0, 0, 1};

            memcpy((RK_U8*)hdr_dynamic_meta->data, start_code, 4);
            memcpy((RK_U8*)hdr_dynamic_meta->data + 4, (RK_U8*)data, size - 4);
        } else
            memcpy((RK_U8*)hdr_dynamic_meta->data, (RK_U8*)data, size);
        hdr_dynamic_meta->size = size;
        hdr_dynamic_meta->hdr_fmt = hdr_fmt;
    }
    p_Cur->hdr_dynamic_meta = hdr_dynamic_meta;
    p_Cur->hdr_dynamic = 1;
}